

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

void __thiscall subprocess::OSError::OSError(OSError *this,string *err_msg,int err_code)

{
  long in_FS_OFFSET;
  string asStackY_78 [4];
  int in_stack_ffffffffffffff8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(&local_58,err_msg,": ");
  SysErrorString_abi_cxx11_(in_stack_ffffffffffffff8c);
  std::operator+(&local_38,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStackY_78);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string(asStackY_78);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)this = &PTR__runtime_error_00643100;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

OSError(const std::string& err_msg, int err_code):
    std::runtime_error(err_msg + ": " + SysErrorString(err_code))
  {}